

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkFlow.c
# Opt level: O3

int Nwk_ManPushForwardFast_rec(Nwk_Obj_t *pObj,Nwk_Obj_t *pPred)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  
  iVar1 = pObj->pMan->nTravIds;
  iVar3 = 0;
  if (pObj->TravId != iVar1) {
    pObj->TravId = iVar1;
    uVar2 = *(uint *)&pObj->field_0x20;
    iVar3 = 0;
    if ((uVar2 & 0x20) == 0) {
      if ((uVar2 & 0x10) == 0) {
        if (0 < pObj->nFanouts) {
          iVar3 = 0;
          lVar4 = 0;
          do {
            if (pObj->pFanio[pObj->nFanins + lVar4] == (Nwk_Obj_t *)0x0) {
              return 0;
            }
            iVar1 = Nwk_ManPushForwardFast_rec(pObj->pFanio[pObj->nFanins + lVar4],pObj);
            if (iVar1 != 0) {
              uVar2 = *(uint *)&pObj->field_0x20;
              goto LAB_008e9b6e;
            }
            lVar4 = lVar4 + 1;
          } while ((int)lVar4 < pObj->nFanouts);
        }
      }
      else {
LAB_008e9b6e:
        *(uint *)&pObj->field_0x20 = uVar2 | 0x20;
        pObj->pCopy = pPred;
        iVar3 = 1;
      }
    }
  }
  return iVar3;
}

Assistant:

int Nwk_ManPushForwardFast_rec( Nwk_Obj_t * pObj, Nwk_Obj_t * pPred )
{
    Nwk_Obj_t * pNext;
    int i;
    if ( Nwk_ObjIsTravIdCurrent( pObj ) )
        return 0;
    Nwk_ObjSetTravIdCurrent( pObj );
    if ( Nwk_ObjHasFlow(pObj) )
        return 0;
    if ( Nwk_ObjIsSink(pObj) )
    {
        Nwk_ObjSetFlow(pObj);
        return Nwk_ObjSetPred( pObj, pPred );
    }
    Nwk_ObjForEachFanout( pObj, pNext, i )
        if ( Nwk_ManPushForwardFast_rec( pNext, pObj ) )
        {
            Nwk_ObjSetFlow(pObj);
            return Nwk_ObjSetPred( pObj, pPred );
        }
    return 0;
}